

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O0

GPU_Camera * GPU_SetCamera(GPU_Camera *__return_storage_ptr__,GPU_Target *target,GPU_Camera *cam)

{
  GPU_Camera *cam_local;
  GPU_Target *target_local;
  
  if (_gpu_current_renderer == (GPU_Renderer *)0x0) {
    GPU_GetDefaultCamera();
  }
  else {
    if (((_gpu_current_renderer->current_context_target == (GPU_Target *)0x0) &&
        (target != (GPU_Target *)0x0)) && (target->context != (GPU_Context *)0x0)) {
      GPU_MakeCurrent(target,target->context->windowID);
    }
    if (_gpu_current_renderer->current_context_target == (GPU_Target *)0x0) {
      GPU_GetDefaultCamera();
    }
    else {
      (*_gpu_current_renderer->impl->SetCamera)
                (__return_storage_ptr__,_gpu_current_renderer,target,cam);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

GPU_Camera GPU_SetCamera(GPU_Target* target, GPU_Camera* cam)
{
    if(_gpu_current_renderer == NULL)
        return GPU_GetDefaultCamera();
    MAKE_CURRENT_IF_NONE(target);
    if(_gpu_current_renderer->current_context_target == NULL)
        return GPU_GetDefaultCamera();
	// TODO: Remove from renderer and flush here
    return _gpu_current_renderer->impl->SetCamera(_gpu_current_renderer, target, cam);
}